

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab11.c
# Opt level: O3

int CheckFromArray(void)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int cost;
  int weight;
  int knapsackCost;
  uint local_3c;
  uint local_38;
  int local_34;
  
  stream.Out = (FILE *)fopen("out.txt","r");
  if ((FILE *)stream.Out == (FILE *)0x0) {
    puts("can\'t open out.txt");
    currentTest = currentTest + 1;
    iVar3 = -1;
  }
  else {
    local_34 = 0;
    pcVar4 = ScanInt(stream.Out,&local_34);
    iVar3 = 1;
    if (pcVar4 == "PASSED") {
      if (local_34 == TestData.Tests[currentTest].KnapsackCost) {
        uVar8 = 0;
        local_38 = 0;
        local_3c = 0;
        iVar3 = __isoc99_fscanf(stream.Out,"%d %d");
        if (iVar3 == 2) {
          lVar7 = 0x10336c;
          uVar8 = 0;
          do {
            lVar5 = currentTest * 0x478;
            if (TestData.Tests[currentTest].CountResultItems <= uVar8) {
              pcVar4 = "Output too long -- failed";
              goto LAB_00102585;
            }
            uVar1 = *(uint *)(lVar7 + -4 + lVar5);
            uVar6 = (ulong)uVar1;
            if (uVar1 != local_38) {
              uVar2 = *(uint *)(lVar7 + lVar5);
              uVar1 = local_38;
LAB_00102595:
              printf("Wrong item output. Found %d %d, but excepted %d %d. -- Failed\n",(ulong)uVar1,
                     (ulong)local_3c,uVar6,(ulong)uVar2);
              goto LAB_001025a3;
            }
            uVar2 = *(uint *)(lVar7 + lVar5);
            if (uVar2 != local_3c) goto LAB_00102595;
            uVar8 = uVar8 + 1;
            iVar3 = __isoc99_fscanf(stream.Out,"%d %d",&local_38,&local_3c);
            lVar7 = lVar7 + 8;
          } while (iVar3 == 2);
        }
        if (uVar8 < TestData.Tests[currentTest].CountResultItems) {
          pcVar4 = "Output too short -- Failed";
LAB_00102585:
          puts(pcVar4);
LAB_001025a3:
          iVar3 = 1;
        }
        else {
          puts("PASSED");
          currentTest = currentTest + 1;
          fclose((FILE *)stream.Out);
          iVar3 = 0;
        }
      }
      else {
        printf("Wrong knapsack cost output. Found %d, but excepted %d. -- Failed\n");
      }
    }
  }
  return iVar3;
}

Assistant:

static int CheckFromArray(void) {
    stream.Out = fopen("out.txt", "r");
    if (!stream.Out) {
        printf("can't open out.txt\n");
        currentTest++;
        return -1;
    }
    int knapsackCost = 0;
    const char* result = ScanInt(stream.Out, &knapsackCost);
    if (result != Pass) {
        return 1;
    }
    if (knapsackCost != TestData.Tests[currentTest].KnapsackCost) {
        printf("Wrong knapsack cost output. Found %d, but excepted %d. -- Failed\n", knapsackCost, TestData.Tests[currentTest].KnapsackCost);
        return 1;
    }
    
    int weight = 0, cost = 0;
    size_t readItemsCount = 0;
    while(fscanf(stream.Out, "%d %d", &weight, &cost) == 2) {
        if (readItemsCount >= TestData.Tests[currentTest].CountResultItems) {
            printf("Output too long -- failed\n");
            return 1;
        }
        if (TestData.Tests[currentTest].Result[readItemsCount].Weight != weight || TestData.Tests[currentTest].Result[readItemsCount].Cost != cost) {
            printf("Wrong item output. Found %d %d, but excepted %d %d. -- Failed\n", weight, cost, TestData.Tests[currentTest].Result[readItemsCount].Weight, TestData.Tests[currentTest].Result[readItemsCount].Cost);
            return 1;
        }
        ++readItemsCount;
    }
    if (readItemsCount < TestData.Tests[currentTest].CountResultItems) {
        printf("Output too short -- Failed\n");
        return 1;
    }
    printf("PASSED\n");
    ++currentTest;
    fclose(stream.Out);
    return 0;
}